

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_shared_ptr.cpp
# Opt level: O2

void __thiscall Fixture::~Fixture(Fixture *this)

{
  uint __line;
  int iVar1;
  char *__assertion;
  
  if (this->state == (IObjectSharedState *)0x0) {
    __assertion = "state";
    __line = 0x18;
  }
  else if (destroyed) {
    __assertion = "!destroyed";
    __line = 0x19;
  }
  else {
    iVar1 = IObjectSharedState::StateCount(this->state);
    if (iVar1 == this->start_state_count) {
      iVar1 = IObjectSharedState::ObjectCount(this->state);
      if (iVar1 == this->start_obj_count) {
        rcc::weak_ptr<TestSharedPtrObj>::~weak_ptr(&this->weak);
        rcc::shared_ptr<TestSharedPtrObj>::~shared_ptr(&this->ptr);
        return;
      }
      __assertion = "state->ObjectCount() == start_obj_count";
      __line = 0x1b;
    }
    else {
      __assertion = "state->StateCount() == start_state_count";
      __line = 0x1a;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dtmoodie[P]RuntimeCompiledCPlusPlus/Aurora/tests/test_shared_ptr.cpp"
                ,__line,"Fixture::~Fixture()");
}

Assistant:

~Fixture(){
        assert(state);
        assert(!destroyed);
        assert(state->StateCount() == start_state_count);
        assert(state->ObjectCount() == start_obj_count);
    }